

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

void Extra_Truth4VarNPN(unsigned_short **puCanons,char **puPhases,char **puPerms,uchar **puMap)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  unsigned_short *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  uchar *__ptr_02;
  char **__ptr_03;
  ulong uVar4;
  int iVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  unsigned_short uVar9;
  ulong uVar10;
  
  __ptr = (unsigned_short *)calloc(1,0x20000);
  __ptr_00 = (char *)calloc(1,0x10000);
  __ptr_01 = (char *)calloc(1,0x10000);
  __ptr_02 = (uchar *)calloc(1,0x10000);
  __ptr_03 = Extra_Permutations(4);
  iVar7 = 1;
  for (uVar10 = 1; uVar10 != 0x8000; uVar10 = uVar10 + 1) {
    uVar4 = (ulong)__ptr[uVar10];
    if (uVar4 == 0) {
      iVar5 = iVar7 + 1;
      __ptr_02[uVar10] = (uchar)iVar7;
      for (iVar7 = 0; iVar7 != 0x10; iVar7 = iVar7 + 1) {
        uVar2 = Extra_TruthPolarize((uint)uVar10,iVar7,4);
        bVar6 = (byte)iVar7;
        for (lVar8 = 0; uVar9 = (unsigned_short)uVar10, lVar8 != 0x18; lVar8 = lVar8 + 1) {
          uVar3 = Extra_TruthPermute(uVar2,__ptr_03[lVar8],4,0);
          if ((ulong)__ptr[uVar3] == 0) {
            __ptr[uVar3] = uVar9;
            __ptr_00[uVar3] = bVar6;
            __ptr_01[uVar3] = (char)lVar8;
            uVar4 = (ulong)(ushort)uVar3 ^ 0xffff;
            __ptr[uVar4] = uVar9;
            __ptr_00[uVar4] = bVar6 | 0x10;
            __ptr_01[uVar4] = (char)lVar8;
          }
          else if (uVar10 != __ptr[uVar3]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                          ,0x2b4,
                          "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
        }
        uVar2 = Extra_TruthPolarize((uint)uVar10 ^ 0xffff,iVar7,4);
        for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 1) {
          uVar3 = Extra_TruthPermute(uVar2,__ptr_03[lVar8],4,0);
          if ((ulong)__ptr[uVar3] == 0) {
            __ptr[uVar3] = uVar9;
            __ptr_00[uVar3] = bVar6;
            __ptr_01[uVar3] = (char)lVar8;
            uVar4 = (ulong)(ushort)uVar3 ^ 0xffff;
            __ptr[uVar4] = uVar9;
            __ptr_00[uVar4] = bVar6 | 0x10;
            __ptr_01[uVar4] = (char)lVar8;
          }
          else if (uVar10 != __ptr[uVar3]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                          ,0x2c6,
                          "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
        }
      }
    }
    else {
      if (uVar10 <= uVar4) {
        __assert_fail("uTruth > uCanons[uTruth]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                      ,0x29d,
                      "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      uVar1 = __ptr_02[uVar4];
      __ptr_02[uVar10] = uVar1;
      __ptr_02[uVar10 & 0xffffffff ^ 0xffff] = uVar1;
      iVar5 = iVar7;
    }
    iVar7 = iVar5;
  }
  __ptr_00[0xffff] = '\x10';
  if (iVar7 == 0xde) {
    free(__ptr_03);
    if (puCanons == (unsigned_short **)0x0) {
      free(__ptr);
    }
    else {
      *puCanons = __ptr;
    }
    if (puPhases == (char **)0x0) {
      free(__ptr_00);
    }
    else {
      *puPhases = __ptr_00;
    }
    if (puPerms == (char **)0x0) {
      free(__ptr_01);
    }
    else {
      *puPerms = __ptr_01;
    }
    if (puMap == (uchar **)0x0) {
      free(__ptr_02);
      return;
    }
    *puMap = __ptr_02;
    return;
  }
  __assert_fail("nClasses == 222",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                ,0x2cb,
                "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
}

Assistant:

void Extra_Truth4VarNPN( unsigned short ** puCanons, char ** puPhases, char ** puPerms, unsigned char ** puMap )
{
    unsigned short * uCanons;
    unsigned char * uMap;
    unsigned uTruth, uPhase, uPerm;
    char ** pPerms4, * uPhases, * uPerms;
    int nFuncs, nClasses;
    int i, k;

    nFuncs  = (1 << 16);
    uCanons = ABC_ALLOC( unsigned short, nFuncs );
    uPhases = ABC_ALLOC( char, nFuncs );
    uPerms  = ABC_ALLOC( char, nFuncs );
    uMap    = ABC_ALLOC( unsigned char, nFuncs );
    memset( uCanons, 0, sizeof(unsigned short) * nFuncs );
    memset( uPhases, 0, sizeof(char) * nFuncs );
    memset( uPerms,  0, sizeof(char) * nFuncs );
    memset( uMap,    0, sizeof(unsigned char) * nFuncs );
    pPerms4 = Extra_Permutations( 4 );

    nClasses = 1;
    nFuncs = (1 << 15);
    for ( uTruth = 1; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            uMap[~uTruth & 0xFFFF] = uMap[uTruth] = uMap[uCanons[uTruth]];
            continue;
        }
        uMap[uTruth] = nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 4 );
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Extra_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
            uPhase = Extra_TruthPolarize( ~uTruth & 0xFFFF, i, 4 ); 
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Extra_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
        }
    }
    uPhases[(1<<16)-1] = 16;
    assert( nClasses == 222 );
    ABC_FREE( pPerms4 );
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( puPerms ) 
        *puPerms = uPerms;
    else
        ABC_FREE( uPerms );
    if ( puMap ) 
        *puMap = uMap;
    else
        ABC_FREE( uMap );
}